

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O0

void loadXYZ(string *filePath,vector<Vector3D,_std::allocator<Vector3D>_> *pos)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  ulong uVar4;
  istream *piVar5;
  double local_3f0;
  double z;
  double y;
  double x;
  stringstream lineStream;
  string local_250 [8];
  string line;
  long local_220;
  ifstream file;
  vector<Vector3D,_std::allocator<Vector3D>_> *pos_local;
  string *filePath_local;
  
  std::ifstream::ifstream(&local_220,(string *)filePath,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    while (bVar2 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&local_220 + *(long *)(local_220 + -0x18))), bVar2) {
      std::__cxx11::string::string(local_250);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_220,local_250);
      uVar4 = std::__cxx11::string::size();
      if (3 < uVar4) {
        _Var3 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream((stringstream *)&x,local_250,_Var3);
        piVar5 = (istream *)std::istream::operator>>((istream *)&x,&y);
        piVar5 = (istream *)std::istream::operator>>(piVar5,&z);
        std::istream::operator>>(piVar5,&local_3f0);
        std::vector<Vector3D,std::allocator<Vector3D>>::emplace_back<double&,double&,double&>
                  ((vector<Vector3D,std::allocator<Vector3D>> *)pos,&y,&z,&local_3f0);
        std::__cxx11::stringstream::~stringstream((stringstream *)&x);
      }
      std::__cxx11::string::~string(local_250);
    }
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&local_220);
  return;
}

Assistant:

void loadXYZ(std::string filePath, std::vector<Vector3D> &pos){
    std::ifstream file(filePath);
    if (file.is_open()){
        while (file){
            std::string line;
            std::getline(file, line);
            if(line.size()>3){
                std::stringstream lineStream(line);
                double x, y, z;
                lineStream >> x >> y >>z;
                pos.emplace_back(x, y, z);
            }
        }
        file.close();
    }




}